

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall
QMenuPrivate::scrollMenu(QMenuPrivate *this,QAction *action,ScrollLocation location,bool active)

{
  long *plVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  QWidget *this_00;
  QWidgetData *pQVar5;
  Representation RVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  QStyle *pQVar14;
  pointer pQVar15;
  QWidget *this_01;
  QMenuScroller *pQVar16;
  byte bVar17;
  uint uVar18;
  QRect *pQVar19;
  long lVar20;
  int i;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  Representation RVar24;
  long lVar25;
  long in_FS_OFFSET;
  QRect QVar26;
  byte local_7c;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->scroll == (QMenuScroller *)0x0) || (this->scroll->scrollFlags == '\0'))
  goto LAB_00421e50;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  updateActionRects(this);
  bVar17 = this->scroll->scrollFlags;
  iVar9 = 0;
  iVar8 = 0;
  if ((bVar17 & 1) != 0) {
    iVar8 = scrollerHeight(this);
    bVar17 = this->scroll->scrollFlags;
  }
  if ((bVar17 & 2) != 0) {
    iVar9 = scrollerHeight(this);
  }
  pQVar14 = QWidget::style(this_00);
  iVar22 = 0;
  iVar10 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x1d,0,this_00);
  pQVar14 = QWidget::style(this_00);
  iVar11 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x1e,0,this_00);
  lVar25 = (this->super_QWidgetPrivate).actions.d.size;
  if (location == ScrollTop) {
    pQVar19 = (this->actionRects).d.ptr;
    iVar9 = 0;
    for (lVar20 = 0; lVar25 << 3 != lVar20; lVar20 = lVar20 + 8) {
      if (*(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar20) == action) {
        uVar12 = iVar8 - iVar9;
        goto LAB_00421b64;
      }
      iVar9 = ((iVar9 + *(int *)((long)&(pQVar19->y2).m_i + lVar20 * 2)) -
              *(int *)((long)&(pQVar19->y1).m_i + lVar20 * 2)) + 1;
    }
LAB_00421b6d:
    uVar12 = 0;
    uVar23 = 0;
  }
  else {
    pQVar19 = (this->actionRects).d.ptr;
    lVar20 = 0;
    do {
      if (lVar25 << 3 == lVar20) goto LAB_00421b6d;
      iVar22 = ((iVar22 + *(int *)((long)&(pQVar19->y2).m_i + lVar20 * 2)) -
               *(int *)((long)&(pQVar19->y1).m_i + lVar20 * 2)) + 1;
      plVar1 = (long *)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar20);
      lVar20 = lVar20 + 8;
    } while ((QAction *)*plVar1 != action);
    iVar3 = (this_00->data->crect).y1.m_i;
    iVar4 = (this_00->data->crect).y2.m_i;
    if (location == ScrollCenter) {
      iVar8 = (iVar8 - (iVar9 + iVar22)) + ((iVar4 - iVar3) + 1) / 2;
    }
    else {
      iVar8 = (iVar4 - (iVar9 + iVar22 + iVar3)) + 1;
    }
    if (iVar8 == 0) goto LAB_00421b6d;
    uVar12 = iVar8 + iVar11 * -2;
LAB_00421b64:
    uVar23 = uVar12 >> 0x1f;
  }
  lVar25 = -0x10;
  uVar13 = uVar12;
  do {
    uVar18 = uVar23;
    if ((this->actionRects).d.size << 4 == lVar25 + 0x10) goto LAB_00421bb7;
    uVar13 = ((uVar13 + *(int *)((long)&pQVar19[1].y2.m_i + lVar25)) -
             *(int *)((long)&pQVar19[1].y1.m_i + lVar25)) + 1;
    lVar25 = lVar25 + 0x10;
  } while ((int)uVar13 <= ((this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i) + 1);
  uVar18 = uVar23 + 2;
LAB_00421bb7:
  local_7c = (byte)uVar18;
  if ((((uVar18 & 2) == 0) && ((this->scroll->scrollFlags & 2) != 0)) &&
     (uVar12 = (((uVar12 - (iVar10 + iVar11 * 2)) + (this_00->data->crect).y2.m_i) -
               (uVar13 + (this_00->data->crect).y1.m_i +
               (int)(this->super_QWidgetPrivate).bottommargin +
               (int)(this->super_QWidgetPrivate).topmargin)) + 1, (this->field_0x421 & 2) != 0)) {
    pQVar14 = QWidget::style(this_00);
    iVar8 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x1f,0,this_00);
    uVar12 = uVar12 - iVar8;
  }
  if (uVar23 == 0) {
    uVar23 = 0;
    if ((this->scroll->scrollFlags & 1) == 0) {
      uVar23 = uVar12;
    }
  }
  else {
    uVar23 = uVar12 - iVar10;
  }
  QVar26 = popupGeometry(this,(QScreen *)0x0);
  pQVar14 = QWidget::style(this_00);
  iVar8 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x20,0,this_00);
  pQVar5 = this_00->data;
  RVar6 = QVar26.y1.m_i;
  if (((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1 <
      QVar26.y2.m_i.m_i - (RVar6.m_i + iVar8 * 2)) {
    local_48.x1.m_i = (pQVar5->crect).x1.m_i;
    local_48.y1.m_i = (pQVar5->crect).y1.m_i;
    local_48.x2.m_i = (pQVar5->crect).x2.m_i;
    local_48.y2.m_i = (pQVar5->crect).y2.m_i;
    iVar9 = this->scroll->scrollOffset;
    uVar12 = (uint)this->scroll->scrollFlags;
    if ((uVar23 - iVar9 == 0 || (int)uVar23 < iVar9) || ((uVar18 & uVar12 & 1) == 0)) {
      if ((uVar18 & 2 & uVar12) != 0) {
        RVar24.m_i = (uVar23 - iVar9) + local_48.y1.m_i;
        if (RVar24.m_i <= iVar8 + RVar6.m_i) {
          RVar24.m_i = iVar8 + RVar6.m_i;
        }
        if (RVar24.m_i < local_48.y1.m_i) {
          local_48.y1.m_i = RVar24.m_i;
          local_7c = local_7c & 0xfe;
          uVar23 = 0;
        }
      }
    }
    else if ((local_48.y2.m_i - local_48.y1.m_i) + 1 <
             (int)((local_48.y2.m_i - local_48.y1.m_i) + (iVar9 - uVar23) + 1)) {
      local_48.y2.m_i = local_48.y2.m_i + (iVar9 - uVar23);
    }
    RVar24.m_i = QVar26.y2.m_i.m_i - iVar8;
    if (RVar24.m_i < local_48.y2.m_i) {
      local_48.y2.m_i = RVar24.m_i;
    }
    if (local_48.y1.m_i < iVar8 + RVar6.m_i) {
      local_48.y1.m_i = iVar8 + RVar6.m_i;
    }
    bVar7 = ::operator!=(&local_48,&pQVar5->crect);
    if (bVar7) {
      QWidget::setGeometry(this_00,&local_48);
    }
  }
  uVar23 = (int)uVar23 >> 0x1f & uVar23;
  pQVar16 = this->scroll;
  uVar12 = pQVar16->scrollOffset;
  iVar8 = uVar23 - uVar12;
  if (((this->field_0x420 & 1) == 0) && (uVar23 != uVar12)) {
    lVar20 = 0;
    lVar25 = 0;
    for (uVar21 = 0; uVar21 < (ulong)(this->actionRects).d.size; uVar21 = uVar21 + 1) {
      pQVar15 = QList<QRect>::data(&this->actionRects);
      piVar2 = (int *)((long)&(pQVar15->y2).m_i + lVar25);
      *piVar2 = *piVar2 + iVar8;
      piVar2 = (int *)((long)&(pQVar15->y1).m_i + lVar25);
      *piVar2 = *piVar2 + iVar8;
      this_01 = QHash<QAction_*,_QWidget_*>::value
                          (&this->widgetItems,
                           (QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar20));
      if (this_01 != (QWidget *)0x0) {
        QWidget::setGeometry(this_01,(QRect *)((long)&(pQVar15->x1).m_i + lVar25));
      }
      lVar25 = lVar25 + 0x10;
      lVar20 = lVar20 + 8;
    }
    pQVar16 = this->scroll;
    uVar12 = pQVar16->scrollOffset;
  }
  pQVar16->scrollOffset = uVar12 + iVar8;
  pQVar16->scrollFlags = local_7c;
  if (active) {
    setCurrentAction(this,action,-1,SelectedFromElsewhere,false);
  }
  QWidget::update(this_00);
LAB_00421e50:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::scrollMenu(QAction *action, QMenuScroller::ScrollLocation location, bool active)
{
    Q_Q(QMenu);
    if (!scroll || !scroll->scrollFlags)
        return;
    updateActionRects();
    int newOffset = 0;
    const int topScroll = (scroll->scrollFlags & QMenuScroller::ScrollUp)   ? scrollerHeight() : 0;
    const int botScroll = (scroll->scrollFlags & QMenuScroller::ScrollDown) ? scrollerHeight() : 0;
    const int vmargin = q->style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, q);
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, q);

    if (location == QMenuScroller::ScrollTop) {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            if (actions.at(i) == action) {
                newOffset = topScroll - saccum;
                break;
            }
            saccum += actionRects.at(i).height();
        }
    } else {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            saccum += actionRects.at(i).height();
            if (actions.at(i) == action) {
                if (location == QMenuScroller::ScrollCenter)
                    newOffset = ((q->height() / 2) - botScroll) - (saccum - topScroll);
                else
                    newOffset = (q->height() - botScroll) - saccum;
                break;
            }
        }
        if (newOffset)
            newOffset -= fw * 2;
    }

    //figure out which scroll flags
    uint newScrollFlags = QMenuScroller::ScrollNone;
    if (newOffset < 0) //easy and cheap one
        newScrollFlags |= QMenuScroller::ScrollUp;
    int saccum = newOffset;
    for(int i = 0; i < actionRects.size(); i++) {
        saccum += actionRects.at(i).height();
        if (saccum > q->height()) {
            newScrollFlags |= QMenuScroller::ScrollDown;
            break;
        }
    }

    if (!(newScrollFlags & QMenuScroller::ScrollDown) && (scroll->scrollFlags & QMenuScroller::ScrollDown)) {
        newOffset = q->height() - (saccum - newOffset) - fw*2 - vmargin - topmargin - bottommargin;    //last item at bottom
        if (tearoff)
            newOffset -= q->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, q);
    }

    if (!(newScrollFlags & QMenuScroller::ScrollUp) && (scroll->scrollFlags & QMenuScroller::ScrollUp)) {
        newOffset = 0;  //first item at top
    }

    if (newScrollFlags & QMenuScroller::ScrollUp)
        newOffset -= vmargin;

    QRect screen = popupGeometry();
    const int desktopFrame = q->style()->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, nullptr, q);
    if (q->height() < screen.height()-(desktopFrame*2)-1) {
        QRect geom = q->geometry();
        if (newOffset > scroll->scrollOffset && (scroll->scrollFlags & newScrollFlags & QMenuScroller::ScrollUp)) { //scroll up
            const int newHeight = geom.height()-(newOffset-scroll->scrollOffset);
            if (newHeight > geom.height())
                geom.setHeight(newHeight);
        } else if (scroll->scrollFlags & newScrollFlags & QMenuScroller::ScrollDown) {
            int newTop = geom.top() + (newOffset-scroll->scrollOffset);
            if (newTop < desktopFrame+screen.top())
                newTop = desktopFrame+screen.top();
            if (newTop < geom.top()) {
                geom.setTop(newTop);
                newOffset = 0;
                newScrollFlags &= ~QMenuScroller::ScrollUp;
            }
        }
        if (geom.bottom() > screen.bottom() - desktopFrame)
            geom.setBottom(screen.bottom() - desktopFrame);
        if (geom.top() < desktopFrame+screen.top())
            geom.setTop(desktopFrame+screen.top());
        if (geom != q->geometry()) {
#if 0
            if (newScrollFlags & QMenuScroller::ScrollDown &&
               q->geometry().top() - geom.top() >= -newOffset)
                newScrollFlags &= ~QMenuScroller::ScrollDown;
#endif
            q->setGeometry(geom);
        }
    }

    //actually update flags
    const int delta = qMin(0, newOffset) - scroll->scrollOffset; //make sure the new offset is always negative
    if (!itemsDirty && delta) {
        //we've scrolled so we need to update the action rects
        for (int i = 0; i < actionRects.size(); ++i) {
            QRect &current = actionRects[i];
            current.moveTop(current.top() + delta);

            //we need to update the widgets geometry
            if (QWidget *w = widgetItems.value(actions.at(i)))
                w->setGeometry(current);
        }
    }
    scroll->scrollOffset += delta;
    scroll->scrollFlags = newScrollFlags;
    if (active)
        setCurrentAction(action);

    q->update();     //issue an update so we see all the new state..
}